

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model_test.cc
# Opt level: O3

void __thiscall
NoiseStrengthSolver_GetCentersTwoBins10bit_Test::TestBody
          (NoiseStrengthSolver_GetCentersTwoBins10bit_Test *this)

{
  SEARCH_METHODS *pSVar1;
  AssertionResult gtest_ar;
  aom_noise_strength_solver_t solver;
  AssertHelper in_stack_ffffffffffffff98;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffffa0;
  char in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffa9;
  undefined8 *local_50;
  double *in_stack_ffffffffffffffc8;
  double in_stack_ffffffffffffffd0;
  double in_stack_ffffffffffffffd8;
  
  aom_noise_strength_solver_init((aom_noise_strength_solver_t *)&stack0xffffffffffffffb8,2,10);
  aom_noise_strength_solver_get_center((aom_noise_strength_solver_t *)&stack0xffffffffffffffb8,0);
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffffa0._M_head_impl,(char *)in_stack_ffffffffffffff98.data_,
             (char *)CONCAT71(in_stack_ffffffffffffffa9,in_stack_ffffffffffffffa8),
             in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,(double)in_stack_ffffffffffffffc8);
  if (in_stack_ffffffffffffffa8 == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffffa0);
    if (local_50 == (undefined8 *)0x0) {
      pSVar1 = "";
    }
    else {
      pSVar1 = (SEARCH_METHODS *)*local_50;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
               ,0x87,(char *)pSVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffff98,(Message *)&stack0xffffffffffffffa0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff98);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )in_stack_ffffffffffffffa0._M_head_impl !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffffa0._M_head_impl + 8))();
    }
  }
  if (local_50 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_50 != local_50 + 2) {
      operator_delete((undefined8 *)*local_50);
    }
    operator_delete(local_50);
  }
  aom_noise_strength_solver_get_center((aom_noise_strength_solver_t *)&stack0xffffffffffffffb8,1);
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffffa0._M_head_impl,(char *)in_stack_ffffffffffffff98.data_,
             (char *)CONCAT71(in_stack_ffffffffffffffa9,in_stack_ffffffffffffffa8),
             in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,(double)in_stack_ffffffffffffffc8);
  if (in_stack_ffffffffffffffa8 == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffffa0);
    if (local_50 == (undefined8 *)0x0) {
      pSVar1 = "";
    }
    else {
      pSVar1 = (SEARCH_METHODS *)*local_50;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
               ,0x88,(char *)pSVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffff98,(Message *)&stack0xffffffffffffffa0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff98);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )in_stack_ffffffffffffffa0._M_head_impl !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffffa0._M_head_impl + 8))();
    }
  }
  if (local_50 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_50 != local_50 + 2) {
      operator_delete((undefined8 *)*local_50);
    }
    operator_delete(local_50);
  }
  aom_noise_strength_solver_free((aom_noise_strength_solver_t *)&stack0xffffffffffffffb8);
  return;
}

Assistant:

TEST(NoiseStrengthSolver, GetCentersTwoBins10bit) {
  aom_noise_strength_solver_t solver;
  aom_noise_strength_solver_init(&solver, 2, 10);
  EXPECT_NEAR(0, aom_noise_strength_solver_get_center(&solver, 0), 1e-5);
  EXPECT_NEAR(1023, aom_noise_strength_solver_get_center(&solver, 1), 1e-5);
  aom_noise_strength_solver_free(&solver);
}